

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

bool __thiscall CTxMemPool::HasNoInputsOf(CTxMemPool *this,CTransaction *tx)

{
  bool bVar1;
  vector<CTxIn,_std::allocator<CTxIn>_> *this_00;
  vector<CTxIn,_std::allocator<CTxIn>_> *pvVar2;
  long in_FS_OFFSET;
  CTxMemPool *unaff_retaddr;
  uint i;
  transaction_identifier<false> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined4 local_44;
  undefined1 local_2a;
  GenTxid *gtxid;
  
  gtxid = *(GenTxid **)(in_FS_OFFSET + 0x28);
  local_44 = 0;
  do {
    this_00 = (vector<CTxIn,_std::allocator<CTxIn>_> *)(ulong)local_44;
    pvVar2 = (vector<CTxIn,_std::allocator<CTxIn>_> *)
             std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff98);
    if (pvVar2 <= this_00) {
      local_2a = true;
LAB_0142afc7:
      if (*(GenTxid **)(in_FS_OFFSET + 0x28) == gtxid) {
        return local_2a;
      }
      __stack_chk_fail();
    }
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              (this_00,CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    transaction_identifier::operator_cast_to_uint256_(in_stack_ffffffffffffff98);
    GenTxid::Txid(&in_stack_ffffffffffffff98->m_wrapped);
    bVar1 = exists(unaff_retaddr,gtxid);
    if (bVar1) {
      local_2a = false;
      goto LAB_0142afc7;
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

bool CTxMemPool::HasNoInputsOf(const CTransaction &tx) const
{
    for (unsigned int i = 0; i < tx.vin.size(); i++)
        if (exists(GenTxid::Txid(tx.vin[i].prevout.hash)))
            return false;
    return true;
}